

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O3

void __thiscall
script_segwit_tests::IsPayToWitnessScriptHash_Invalid_Size::test_method
          (IsPayToWitnessScriptHash_Invalid_Size *this)

{
  bool bVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string msg;
  uint160 dummy;
  char *local_c0;
  char *local_b8;
  lazy_ostream local_b0;
  undefined1 *local_a0;
  char **local_98;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  undefined1 local_58 [28];
  uint uStack_3c;
  uchar local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_58._16_8_ = 0;
  stack0xffffffffffffffc0 = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  local_b0._vptr_lazy_ostream =
       (_func_int **)((ulong)local_b0._vptr_lazy_ostream & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
             (uchar *)&local_b0);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b0,local_38,
             local_38 + 0x14,(allocator_type *)&local_90);
  b._M_extent._M_extent_value =
       CONCAT71(local_b0._9_7_,local_b0.m_empty) - (long)local_b0._vptr_lazy_ostream;
  b._M_ptr = (pointer)local_b0._vptr_lazy_ostream;
  CScript::operator<<((CScript *)local_58,b);
  if (local_b0._vptr_lazy_ostream != (_func_int **)0x0) {
    operator_delete(local_b0._vptr_lazy_ostream,(long)local_a0 - (long)local_b0._vptr_lazy_ostream);
  }
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_68;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  bVar1 = CScript::IsPayToWitnessScriptHash((CScript *)local_58);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98 = &local_c0;
  local_c0 = "!notp2wsh.IsPayToWitnessScriptHash()";
  local_b8 = "";
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_b0,1,0,WARN,0xea3fa9,(size_t)&stack0xffffffffffffff30,0x25);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if (0x1c < uStack_3c) {
    free((void *)local_58._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPayToWitnessScriptHash_Invalid_Size)
{
    uint160 dummy;
    CScript notp2wsh;
    notp2wsh << OP_0 << ToByteVector(dummy);
    BOOST_CHECK(!notp2wsh.IsPayToWitnessScriptHash());
}